

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

void updateObjects(QList<const_QObject_*> *objects)

{
  bool bVar1;
  QWidget *pQVar2;
  QStyle *pQVar3;
  QObjectList *pQVar4;
  const_iterator o;
  QObject **ppQVar5;
  QList<const_QObject_*> *in_RDI;
  long in_FS_OFFSET;
  QObject *child;
  add_const_t<const_QList<QObject_*>_> *__range3;
  QWidget *widget;
  QObject *object_1;
  QList<const_QObject_*> *__range1;
  QList<const_QObject_*> *__range2;
  const_iterator __end3;
  const_iterator __begin3;
  QList<const_QObject_*> children;
  const_iterator __end1;
  const_iterator __begin1;
  QEvent event;
  QObject *object;
  const_iterator __end2;
  const_iterator __begin2;
  QWidget *in_stack_ffffffffffffff48;
  QList<const_QObject_*> *in_stack_ffffffffffffff50;
  QList<const_QObject_*> *in_stack_ffffffffffffff70;
  const_iterator local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  QObject **local_50;
  const_iterator asize;
  const_iterator local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  QObject *local_28;
  QObject **local_20;
  const_iterator local_18;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QHash<const_QObject_*,_QList<QCss::StyleRule>_>::isEmpty
                    (&styleSheetCaches->styleRulesCache);
  if (((!bVar1) ||
      (bVar1 = QHash<const_QObject_*,_QHash<int,_bool>_>::isEmpty
                         (&styleSheetCaches->hasStyleRuleCache), !bVar1)) ||
     (bVar1 = QHash<const_QObject_*,_QHash<int,_QHash<unsigned_long_long,_QRenderRule>_>_>::isEmpty
                        (&styleSheetCaches->renderRulesCache), !bVar1)) {
    in_stack_ffffffffffffff70 = in_RDI;
    local_10.i = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
    in_RDI = in_stack_ffffffffffffff70;
    local_10 = QList<const_QObject_*>::begin(in_stack_ffffffffffffff50);
    local_18.i = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
    local_18 = QList<const_QObject_*>::end(in_stack_ffffffffffffff50);
    while( true ) {
      local_20 = local_18.i;
      bVar1 = QList<const_QObject_*>::const_iterator::operator!=(&local_10,local_18);
      if (!bVar1) break;
      ppQVar5 = QList<const_QObject_*>::const_iterator::operator*(&local_10);
      local_28 = *ppQVar5;
      QHash<const_QObject_*,_QList<QCss::StyleRule>_>::remove
                (&styleSheetCaches->styleRulesCache,(char *)&local_28);
      QHash<const_QObject_*,_QHash<int,_bool>_>::remove
                (&styleSheetCaches->hasStyleRuleCache,(char *)&local_28);
      QHash<const_QObject_*,_QHash<int,_QHash<unsigned_long_long,_QRenderRule>_>_>::remove
                (&styleSheetCaches->renderRulesCache,(char *)&local_28);
      QList<const_QObject_*>::const_iterator::operator++(&local_10);
    }
  }
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_38,StyleChange);
  local_40.i = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
  local_40 = QList<const_QObject_*>::begin(in_stack_ffffffffffffff50);
  local_50 = (QObject **)QList<const_QObject_*>::end(in_stack_ffffffffffffff50);
  while (asize.i = local_50,
        bVar1 = QList<const_QObject_*>::const_iterator::operator!=
                          (&local_40,(const_iterator)local_50), bVar1) {
    QList<const_QObject_*>::const_iterator::operator*(&local_40);
    pQVar2 = qobject_cast<QWidget*>(&in_stack_ffffffffffffff48->super_QObject);
    if (pQVar2 != (QWidget *)0x0) {
      pQVar3 = QWidget::style(in_stack_ffffffffffffff48);
      (**(code **)(*(long *)pQVar3 + 0x60))(pQVar3,pQVar2);
      QCoreApplication::sendEvent(&pQVar2->super_QObject,(QEvent *)&local_38);
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      local_60 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      QList<const_QObject_*>::QList((QList<const_QObject_*> *)0x42c711);
      pQVar4 = QObject::children((QObject *)0x42c71b);
      QList<QObject_*>::size(pQVar4);
      QList<const_QObject_*>::reserve(in_RDI,(qsizetype)asize.i);
      pQVar4 = QObject::children((QObject *)0x42c74d);
      local_70.i = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
      local_70 = QList<QObject_*>::begin(pQVar4);
      o = QList<QObject_*>::end(pQVar4);
      while (bVar1 = QList<QObject_*>::const_iterator::operator!=(&local_70,o), bVar1) {
        ppQVar5 = QList<QObject_*>::const_iterator::operator*(&local_70);
        in_stack_ffffffffffffff48 = (QWidget *)*ppQVar5;
        QList<const_QObject_*>::append
                  ((QList<const_QObject_*> *)0x42c7c6,(parameter_type)in_stack_ffffffffffffff48);
        QList<QObject_*>::const_iterator::operator++(&local_70);
      }
      updateObjects(in_stack_ffffffffffffff70);
      QList<const_QObject_*>::~QList((QList<const_QObject_*> *)0x42c7e6);
    }
    QList<const_QObject_*>::const_iterator::operator++(&local_40);
    local_50 = asize.i;
  }
  QEvent::~QEvent((QEvent *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void updateObjects(const QList<const QObject *>& objects)
{
    if (!styleSheetCaches->styleRulesCache.isEmpty() || !styleSheetCaches->hasStyleRuleCache.isEmpty() || !styleSheetCaches->renderRulesCache.isEmpty()) {
        for (const QObject *object : objects) {
            styleSheetCaches->styleRulesCache.remove(object);
            styleSheetCaches->hasStyleRuleCache.remove(object);
            styleSheetCaches->renderRulesCache.remove(object);
        }
    }

    QEvent event(QEvent::StyleChange);
    for (const QObject *object : objects) {
        if (auto widget = qobject_cast<QWidget*>(const_cast<QObject*>(object))) {
            widget->style()->polish(widget);
            QCoreApplication::sendEvent(widget, &event);
            QList<const QObject *> children;
            children.reserve(widget->children().size() + 1);
            for (auto child: std::as_const(widget->children()))
                children.append(child);
            updateObjects(children);
        }
    }
}